

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void __thiscall
testing::internal::PrettyUnitTestResultPrinter::OnTestCaseEnd
          (PrettyUnitTestResultPrinter *this,TestCase *test_case)

{
  undefined8 uVar1;
  char *pcVar2;
  undefined8 uVar3;
  TestCase *in_RSI;
  undefined8 in_RDI;
  int count;
  string counts;
  string local_60 [8];
  longlong *in_stack_ffffffffffffffa8;
  string local_30 [24];
  char *in_stack_ffffffffffffffe8;
  
  count = (int)((ulong)in_RDI >> 0x20);
  if ((FLAGS_gtest_print_time & 1) != 0) {
    TestCase::test_to_run_count((TestCase *)0x1881ff);
    FormatCountableNoun_abi_cxx11_(count,(char *)in_RSI,in_stack_ffffffffffffffe8);
    ColoredPrintf(COLOR_GREEN,"[----------] ");
    uVar1 = std::__cxx11::string::c_str();
    pcVar2 = TestCase::name((TestCase *)0x188247);
    TestCase::elapsed_time(in_RSI);
    StreamableToString<long_long>(in_stack_ffffffffffffffa8);
    uVar3 = std::__cxx11::string::c_str();
    printf("%s from %s (%s ms total)\n\n",uVar1,pcVar2,uVar3);
    std::__cxx11::string::~string(local_60);
    fflush(_stdout);
    std::__cxx11::string::~string(local_30);
  }
  return;
}

Assistant:

void PrettyUnitTestResultPrinter::OnTestCaseEnd(const TestCase& test_case) {
  if (!GTEST_FLAG(print_time)) return;

  const std::string counts =
      FormatCountableNoun(test_case.test_to_run_count(), "test", "tests");
  ColoredPrintf(COLOR_GREEN, "[----------] ");
  printf("%s from %s (%s ms total)\n\n",
         counts.c_str(), test_case.name(),
         internal::StreamableToString(test_case.elapsed_time()).c_str());
  fflush(stdout);
}